

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O3

StructType * __thiscall
deqp::gles3::Functional::TransformFeedback::ProgramSpec::createStruct(ProgramSpec *this,char *name)

{
  StructType *this_00;
  allocator<char> local_21;
  StructType *local_20;
  
  std::vector<glu::StructType_*,_std::allocator<glu::StructType_*>_>::reserve
            (&this->m_structs,
             ((long)(this->m_structs).
                    super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_structs).
                    super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  this_00 = (StructType *)operator_new(0x38);
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,name,&local_21);
  (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->m_members).super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = this_00;
  std::vector<glu::StructType*,std::allocator<glu::StructType*>>::emplace_back<glu::StructType*>
            ((vector<glu::StructType*,std::allocator<glu::StructType*>> *)this,&local_20);
  return (this->m_structs).super__Vector_base<glu::StructType_*,_std::allocator<glu::StructType_*>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

glu::StructType* ProgramSpec::createStruct (const char* name)
{
	m_structs.reserve(m_structs.size()+1);
	m_structs.push_back(new glu::StructType(name));
	return m_structs.back();
}